

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_validfilename(char *fname)

{
  char *pcVar1;
  char *ext;
  char *fname_local;
  
  if ((fname == (char *)0x0) || (*fname == '\0')) {
    if (1 < g_opts.debug) {
      fprintf(_stderr,"-- empty filename in nifti_validfilename()\n");
    }
    fname_local._4_4_ = 0;
  }
  else {
    pcVar1 = nifti_find_file_extension(fname);
    if ((pcVar1 == (char *)0x0) || (pcVar1 != fname)) {
      fname_local._4_4_ = 1;
    }
    else {
      if (0 < g_opts.debug) {
        fprintf(_stderr,"-- no prefix for filename \'%s\'\n",fname);
      }
      fname_local._4_4_ = 0;
    }
  }
  return fname_local._4_4_;
}

Assistant:

int nifti_validfilename(const char* fname)
{
   const char * ext;

   /* check input file(s) for sanity */
   if( fname == NULL || *fname == '\0' ){
      if ( g_opts.debug > 1 )
         fprintf(stderr,"-- empty filename in nifti_validfilename()\n");
      return 0;
   }

   ext = nifti_find_file_extension(fname);

   if ( ext && ext == fname ) {   /* then no filename prefix */
      if ( g_opts.debug > 0 )
         fprintf(stderr,"-- no prefix for filename '%s'\n", fname);
      return 0;
   }

   return 1;
}